

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlSetObjectBool(JlDataObject *BoolObject,_Bool BoolValue)

{
  JL_STATUS local_18;
  JL_STATUS jlStatus;
  _Bool BoolValue_local;
  JlDataObject *BoolObject_local;
  
  if (BoolObject == (JlDataObject *)0x0) {
    local_18 = JL_STATUS_INVALID_PARAMETER;
  }
  else if (BoolObject->Type == JL_DATA_TYPE_BOOL) {
    (BoolObject->field_2).Boolean = BoolValue;
    local_18 = JL_STATUS_SUCCESS;
  }
  else {
    local_18 = JL_STATUS_WRONG_TYPE;
  }
  return local_18;
}

Assistant:

JL_STATUS
    JlSetObjectBool
    (
        JlDataObject*   BoolObject,
        bool            BoolValue
    )
{
    JL_STATUS jlStatus;

    if( NULL != BoolObject )
    {
        if( JL_DATA_TYPE_BOOL == BoolObject->Type )
        {
            BoolObject->Boolean = BoolValue ? true : false;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}